

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffComplex<KTXcubemapIncomplete>::printText
          (DiffComplex<KTXcubemapIncomplete> *this,size_t index,PrintIndent *out,char *prefix)

{
  KVEntry *this_00;
  string local_48;
  char *local_28;
  
  this_00 = (KVEntry *)(this->values + index);
  local_28 = prefix;
  if (*(int *)((long)&this->values[index].super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                      _M_payload.super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                      super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) == 1) {
    PrintIndent::operator()(out,0,(char (*) [2])0x1cebe2);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\0');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    positiveX: {}\n",&local_28,(char **)&local_48);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\x01');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    negativeX: {}\n",&local_28,(char **)&local_48);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\x02');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    positiveY: {}\n",&local_28,(char **)&local_48);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\x03');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    negativeY: {}\n",&local_28,(char **)&local_48);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\x04');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    positiveZ: {}\n",&local_28,(char **)&local_48);
    local_48._M_dataplus._M_p =
         CommandCompare::compareKVEntry::KTXcubemapIncomplete::bitValue
                   ((KTXcubemapIncomplete *)this_00,'\x05');
    PrintIndent::operator()
              (out,0,(char (*) [21])"{}    negativeZ: {}\n",&local_28,(char **)&local_48);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_(&local_48,this_00,true," ");
    PrintIndent::operator()(out,0,(char (*) [5])0x1d0d6d,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }